

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::runInLoop(EventLoop *this,Functor *cb)

{
  bool bVar1;
  function<void_()> local_38;
  Functor *local_18;
  Functor *cb_local;
  EventLoop *this_local;
  
  local_18 = cb;
  cb_local = (Functor *)this;
  bVar1 = isInLoopThread(this);
  if (bVar1) {
    std::function<void_()>::operator()(cb);
  }
  else {
    std::function<void_()>::function(&local_38,cb);
    queueInLoop(this,&local_38);
    std::function<void_()>::~function(&local_38);
  }
  return;
}

Assistant:

void EventLoop::runInLoop(Functor cb)
{
	// 如果是当前IO线程调用runInLoop，则同步调用cb
	if (isInLoopThread())
	{
		cb();
	}
	// 如果是其它线程调用runInLoop，则异步地将cb添加到队列
	else
	{
		queueInLoop(std::move(cb));
	}
}